

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

string * __thiscall
flatbuffers::go::GoGenerator::WrapInNameSpaceAndTrack
          (string *__return_storage_ptr__,GoGenerator *this,Definition *def,string *name)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pair<std::_Rb_tree_const_iterator<const_flatbuffers::Definition_*>,_bool> pVar3;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _Base_ptr local_38;
  undefined1 local_30;
  string *local_28;
  string *name_local;
  Definition *def_local;
  GoGenerator *this_local;
  
  local_28 = name;
  name_local = &def->name;
  def_local = (Definition *)this;
  this_local = (GoGenerator *)__return_storage_ptr__;
  iVar2 = (*(this->super_BaseGenerator)._vptr_BaseGenerator[3])();
  if (CONCAT44(extraout_var,iVar2) == name_local[5]._M_string_length) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_28);
  }
  else {
    pVar3 = std::
            set<const_flatbuffers::Definition_*,_flatbuffers::go::GoGenerator::NamespacePtrLess,_std::allocator<const_flatbuffers::Definition_*>_>
            ::insert(&this->tracked_imported_namespaces_,(value_type *)&name_local);
    local_38 = (_Base_ptr)pVar3.first._M_node;
    local_30 = pVar3.second;
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)name_local[5]._M_string_length);
    if (bVar1) {
      std::operator+(&local_58,name_local,".");
      std::operator+(__return_storage_ptr__,&local_58,local_28);
      std::__cxx11::string::~string((string *)&local_58);
    }
    else {
      NamespaceImportName_abi_cxx11_(&local_a8,this,(Namespace *)name_local[5]._M_string_length);
      std::operator+(&local_88,&local_a8,".");
      std::operator+(__return_storage_ptr__,&local_88,local_28);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string WrapInNameSpaceAndTrack(const Definition *def,
                                      const std::string &name) {
    if (CurrentNameSpace() == def->defined_namespace) return name;
    tracked_imported_namespaces_.insert(def);
    if (def->defined_namespace->components.empty())
      return def->name + "." + name;
    else
      return NamespaceImportName(def->defined_namespace) + "." + name;
  }